

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.capnp.h
# Opt level: O0

Builder * __thiscall
capnp::compiler::Declaration::Builder::initField(Builder *__return_storage_ptr__,Builder *this)

{
  StructBuilder base;
  uint uVar1;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  PointerBuilder local_40;
  PointerBuilder local_28;
  Builder *local_10;
  Builder *this_local;
  
  local_10 = this;
  uVar1 = bounded<1u>();
  _::StructBuilder::setDataField<capnp::compiler::Declaration::Which>(&this->_builder,uVar1,FIELD);
  uVar1 = bounded<6u>();
  _::StructBuilder::setDataField<unsigned_short>(&this->_builder,uVar1,0);
  uVar1 = bounded<5u>();
  _::StructBuilder::getPointerField(&local_28,&this->_builder,uVar1);
  _::PointerBuilder::clear(&local_28);
  uVar1 = bounded<6u>();
  _::StructBuilder::getPointerField(&local_40,&this->_builder,uVar1);
  _::PointerBuilder::clear(&local_40);
  memcpy(&local_68,this,0x28);
  base.capTable = (CapTableBuilder *)uStack_60;
  base.segment = (SegmentBuilder *)local_68;
  base.data = (void *)local_58;
  base.pointers = (WirePointer *)uStack_50;
  base.dataSize = (undefined4)local_48;
  base.pointerCount = local_48._4_2_;
  base._38_2_ = local_48._6_2_;
  Field::Builder::Builder(__return_storage_ptr__,base);
  return __return_storage_ptr__;
}

Assistant:

inline typename Declaration::Field::Builder Declaration::Builder::initField() {
  _builder.setDataField<Declaration::Which>(
      ::capnp::bounded<1>() * ::capnp::ELEMENTS, Declaration::FIELD);
  _builder.setDataField< ::uint16_t>(::capnp::bounded<6>() * ::capnp::ELEMENTS, 0);
  _builder.getPointerField(::capnp::bounded<5>() * ::capnp::POINTERS).clear();
  _builder.getPointerField(::capnp::bounded<6>() * ::capnp::POINTERS).clear();
  return typename Declaration::Field::Builder(_builder);
}